

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError GetSizeParameter(GlobalConfig *global,char *arg,char *which,curl_off_t *value_out)

{
  CURLofft CVar1;
  size_t sVar2;
  long local_40;
  curl_off_t value;
  char *unit;
  curl_off_t *value_out_local;
  char *which_local;
  char *arg_local;
  GlobalConfig *global_local;
  
  unit = (char *)value_out;
  value_out_local = (curl_off_t *)which;
  which_local = arg;
  arg_local = (char *)global;
  CVar1 = curlx_strtoofft(arg,(char **)&value,0,&local_40);
  if (CVar1 == CURL_OFFT_OK) {
    if (*(char *)value == '\0') {
      value = (long)"$b" + 1;
    }
    else {
      sVar2 = strlen((char *)value);
      if (1 < sVar2) {
        value = (long)"$w" + 1;
      }
    }
    switch(*(undefined1 *)value) {
    case 0x42:
    case 0x62:
      break;
    default:
      warnf((GlobalConfig *)arg_local,"unsupported %s unit. Use G, M, K or B!\n",value_out_local);
      return PARAM_BAD_USE;
    case 0x47:
    case 0x67:
      if (0x1ffffffff < local_40) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      local_40 = local_40 << 0x1e;
      break;
    case 0x4b:
    case 0x6b:
      if (0x1fffffffffffff < local_40) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      local_40 = local_40 << 10;
      break;
    case 0x4d:
    case 0x6d:
      if (0x7ffffffffff < local_40) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      local_40 = local_40 << 0x14;
    }
    *(long *)unit = local_40;
    global_local._4_4_ = PARAM_OK;
  }
  else {
    warnf((GlobalConfig *)arg_local,"invalid number specified for %s\n",value_out_local);
    global_local._4_4_ = PARAM_BAD_USE;
  }
  return global_local._4_4_;
}

Assistant:

static ParameterError GetSizeParameter(struct GlobalConfig *global,
                                       const char *arg,
                                       const char *which,
                                       curl_off_t *value_out)
{
  char *unit;
  curl_off_t value;

  if(curlx_strtoofft(arg, &unit, 0, &value)) {
    warnf(global, "invalid number specified for %s\n", which);
    return PARAM_BAD_USE;
  }

  if(!*unit)
    unit = (char *)"b";
  else if(strlen(unit) > 1)
    unit = (char *)"w"; /* unsupported */

  switch(*unit) {
  case 'G':
  case 'g':
    if(value > (CURL_OFF_T_MAX / (1024*1024*1024)))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024*1024*1024;
    break;
  case 'M':
  case 'm':
    if(value > (CURL_OFF_T_MAX / (1024*1024)))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024*1024;
    break;
  case 'K':
  case 'k':
    if(value > (CURL_OFF_T_MAX / 1024))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024;
    break;
  case 'b':
  case 'B':
    /* for plain bytes, leave as-is */
    break;
  default:
    warnf(global, "unsupported %s unit. Use G, M, K or B!\n", which);
    return PARAM_BAD_USE;
  }
  *value_out = value;
  return PARAM_OK;
}